

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void slang::ast::CoverCrossSymbol::fromSyntax
               (Scope *scope,CoverCrossSyntax *syntax,
               SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  size_type sVar1;
  pointer ppMVar2;
  SyntaxNode *syntax_00;
  pointer ppCVar3;
  int iVar4;
  IdentifierNameSyntax *syntax_01;
  Symbol *this;
  Compilation *pCVar5;
  undefined4 extraout_var;
  CoverCrossSymbol *this_00;
  CoverCrossBodySymbol *symbol;
  TypeAliasType *pTVar6;
  QueueType *pQVar7;
  CoverageOptionSyntax *syntax_02;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  Token *this_01;
  Scope *scope_00;
  long lVar8;
  long lVar9;
  string_view name;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> sVar10;
  LookupLocation lookupLocation;
  StructBuilder valType;
  SmallVector<const_slang::ast::CoverpointSymbol_*,_5UL> targets;
  OptionBuilder options;
  SourceLocation local_2b8;
  CoverCrossSyntax *local_2b0;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_2a8;
  StructBuilder local_2a0;
  string_view local_288;
  CoverCrossSymbol *local_270;
  CoverCrossBodySymbol *local_268;
  Scope *local_260;
  CoverCrossSymbol *local_258;
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*> local_250 [2];
  OptionBuilder local_210;
  
  local_288 = (string_view)ZEXT816(0);
  local_2a8 = results;
  if (syntax->label == (NamedLabelSyntax *)0x0) {
    this_01 = &syntax->cross;
  }
  else {
    local_288 = parsing::Token::valueText(&syntax->label->name);
    this_01 = &syntax->label->name;
  }
  local_2b8 = parsing::Token::location(this_01);
  local_250[0].data_ = (pointer)local_250[0].firstElement;
  local_250[0].len = 0;
  local_210.options.super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_ = (pointer)0x0;
  local_250[0].cap = 5;
  sVar1 = (syntax->items).elements.size_;
  src = extraout_RDX;
  local_2b0 = syntax;
  local_210.scope = (Scope *)&syntax->items;
  for (; (local_210.scope != (Scope *)&syntax->items ||
         (local_210.options.super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_ !=
          (pointer)(sVar1 + 1 >> 1)));
      local_210.options.super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_ =
           (pointer)((long)&((local_210.options.
                              super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_)->scope)
                            .ptr + 1)) {
    syntax_01 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                iterator_base<const_slang::syntax::IdentifierNameSyntax_*>::operator*
                          ((iterator_base<const_slang::syntax::IdentifierNameSyntax_*> *)&local_210)
    ;
    name = parsing::Token::valueText(&syntax_01->identifier);
    this = Scope::find(scope,name);
    if ((this == (Symbol *)0x0) || (this->kind != Coverpoint)) {
      pCVar5 = (Compilation *)CoverpointSymbol::fromImplicit(scope,syntax_01);
      local_2a0.compilation = pCVar5;
      SmallVectorBase<slang::ast::CoverpointSymbol_const*>::
      emplace_back<slang::ast::CoverpointSymbol_const*>
                ((SmallVectorBase<slang::ast::CoverpointSymbol_const*> *)local_250,
                 (CoverpointSymbol **)&local_2a0);
      local_2a0.compilation = pCVar5;
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)local_2a8,(Symbol **)&local_2a0);
      src = extraout_RDX_01;
    }
    else {
      local_2a0.compilation = (Compilation *)Symbol::as<slang::ast::CoverpointSymbol>(this);
      SmallVectorBase<slang::ast::CoverpointSymbol_const*>::
      emplace_back<slang::ast::CoverpointSymbol_const*>
                ((SmallVectorBase<slang::ast::CoverpointSymbol_const*> *)local_250,
                 (CoverpointSymbol **)&local_2a0);
      src = extraout_RDX_00;
    }
  }
  pCVar5 = scope->compilation;
  iVar4 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::copy
                    (local_250,(EVP_PKEY_CTX *)pCVar5,src);
  local_210.scope = (Scope *)CONCAT44(extraout_var,iVar4);
  this_00 = BumpAllocator::
            emplace<slang::ast::CoverCrossSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,nonstd::span_lite::span<slang::ast::CoverpointSymbol_const*,18446744073709551615ul>>
                      (&pCVar5->super_BumpAllocator,pCVar5,&local_288,&local_2b8,
                       (span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL> *)
                       &local_210);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)local_2b0;
  syntax_03 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(local_2b0->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_03);
  symbol = BumpAllocator::
           emplace<slang::ast::CoverCrossBodySymbol,slang::ast::Compilation&,slang::SourceLocation&>
                     (&pCVar5->super_BumpAllocator,pCVar5,&local_2b8);
  local_260 = &this_00->super_Scope;
  Scope::addMember(local_260,&symbol->super_Symbol);
  scope_00 = &symbol->super_Scope;
  lookupLocation._12_4_ = 0;
  lookupLocation.scope = (Scope *)0x0;
  lookupLocation.index = 0;
  local_270 = this_00;
  local_268 = symbol;
  StructBuilder::StructBuilder(&local_2a0,scope_00,lookupLocation);
  ppCVar3 = local_250[0].data_;
  lVar8 = local_250[0].len << 3;
  for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 8) {
    StructBuilder::addField
              (&local_2a0,*(string_view *)(*(long *)((long)ppCVar3 + lVar9) + 8),
               (DeclaredType *)(*(long *)((long)ppCVar3 + lVar9) + 0x70),
               (bitmask<slang::ast::VariableFlags>)0x0);
  }
  pTVar6 = BumpAllocator::
           emplace<slang::ast::TypeAliasType,char_const(&)[13],slang::SourceLocation&>
                     (&pCVar5->super_BumpAllocator,(char (*) [13])"CrossValType",&local_2b8);
  (pTVar6->targetType).type = &(local_2a0.type)->super_Type;
  Scope::addMember(scope_00,(Symbol *)pTVar6);
  local_210.scope = (Scope *)((ulong)local_210.scope & 0xffffffff00000000);
  pQVar7 = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::TypeAliasType&,unsigned_int>
                     (&pCVar5->super_BumpAllocator,pTVar6,(uint *)&local_210);
  pTVar6 = BumpAllocator::
           emplace<slang::ast::TypeAliasType,char_const(&)[15],slang::SourceLocation&>
                     (&pCVar5->super_BumpAllocator,(char (*) [15])"CrossQueueType",&local_2b8);
  (pTVar6->targetType).type = &pQVar7->super_Type;
  Scope::addMember(scope_00,(Symbol *)pTVar6);
  local_268->crossQueueType = &pTVar6->super_Type;
  anon_unknown.dwarf_104bc06::OptionBuilder::OptionBuilder(&local_210,local_260);
  ppMVar2 = (local_2b0->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            data_;
  sVar1 = (local_2b0->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          size_;
  for (lVar8 = 0; sVar1 << 3 != lVar8; lVar8 = lVar8 + 8) {
    syntax_00 = *(SyntaxNode **)((long)ppMVar2 + lVar8);
    if (syntax_00->kind == CoverageOption) {
      syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::CoverageOptionSyntax>(syntax_00);
      anon_unknown.dwarf_104bc06::OptionBuilder::add(&local_210,syntax_02);
    }
    else {
      Scope::addMembers(scope_00,syntax_00);
    }
  }
  sVar10 = anon_unknown.dwarf_104bc06::OptionBuilder::get(&local_210);
  local_270->options = sVar10;
  local_258 = local_270;
  SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
            ((SmallVectorBase<slang::ast::Symbol_const*> *)local_2a8,(Symbol **)&local_258);
  anon_unknown.dwarf_104bc06::OptionBuilder::~OptionBuilder(&local_210);
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::~SmallVectorBase(local_250);
  return;
}

Assistant:

void CoverCrossSymbol::fromSyntax(const Scope& scope, const CoverCrossSyntax& syntax,
                                  SmallVectorBase<const Symbol*>& results) {
    string_view name;
    SourceLocation loc;
    if (syntax.label) {
        name = syntax.label->name.valueText();
        loc = syntax.label->name.location();
    }
    else {
        loc = syntax.cross.location();
    }

    SmallVector<const CoverpointSymbol*> targets;
    for (auto item : syntax.items) {
        auto symbol = scope.find(item->identifier.valueText());
        if (symbol && symbol->kind == SymbolKind::Coverpoint) {
            targets.push_back(&symbol->as<CoverpointSymbol>());
        }
        else {
            // If we didn't find a coverpoint, create one implicitly
            // that will be initialized with this expression.
            auto& newPoint = CoverpointSymbol::fromImplicit(scope, *item);
            targets.push_back(&newPoint);
            results.push_back(&newPoint);
        }
    }

    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverCrossSymbol>(comp, name, loc, targets.copy(comp));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    auto body = comp.emplace<CoverCrossBodySymbol>(comp, loc);
    result->addMember(*body);

    StructBuilder valType(*body, LookupLocation::min);
    for (auto item : targets)
        valType.addField(item->name, item->declaredType);

    auto valType_t = comp.emplace<TypeAliasType>("CrossValType", loc);
    valType_t->targetType.setType(valType.type);
    body->addMember(*valType_t);

    auto queueType = comp.emplace<QueueType>(*valType_t, 0u);
    auto queueType_t = comp.emplace<TypeAliasType>("CrossQueueType", loc);
    queueType_t->targetType.setType(*queueType);
    body->addMember(*queueType_t);
    body->crossQueueType = queueType_t;

    OptionBuilder options(*result);
    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::CoverageOption)
            options.add(member->as<CoverageOptionSyntax>());
        else
            body->addMembers(*member);
    }

    result->options = options.get();
    results.push_back(result);
}